

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON_bool cVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  if (which < 0) {
    return 0;
  }
  if (array != (cJSON *)0x0) {
    uVar4 = (ulong)(uint)which;
    pcVar2 = (cJSON *)&array->child;
    pcVar3 = pcVar2;
    do {
      pcVar3 = pcVar3->next;
      bVar5 = uVar4 != 0;
      uVar4 = uVar4 - 1;
      if (pcVar3 == (cJSON *)0x0) break;
    } while (bVar5);
    if (pcVar3 != (cJSON *)0x0) {
      newitem->next = pcVar3;
      newitem->prev = pcVar3->prev;
      pcVar3->prev = newitem;
      if (pcVar3 != *(cJSON **)pcVar2) {
        pcVar2 = newitem->prev;
      }
      pcVar2->next = newitem;
      return 1;
    }
  }
  cVar1 = add_item_to_array(array,newitem);
  return cVar1;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}